

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyline.cpp
# Opt level: O0

bool __thiscall
ON_Polyline::CreateCircumscribedPolygon(ON_Polyline *this,ON_Circle *circle,int side_count)

{
  double dVar1;
  bool bVar2;
  ON_3dPoint *pOVar3;
  ON_3dPoint *pOVar4;
  double dVar5;
  bool local_dd;
  ON_3dPoint local_d0;
  undefined1 local_b8 [8];
  ON_Circle c;
  int i;
  double half_a;
  bool rc;
  int side_count_local;
  ON_Circle *circle_local;
  ON_Polyline *this_local;
  
  bVar2 = ON_Circle::IsValid(circle);
  local_dd = bVar2 && 2 < side_count;
  if (bVar2 && 2 < side_count) {
    ON_SimpleArray<ON_3dPoint>::SetCapacity
              ((ON_SimpleArray<ON_3dPoint> *)this,(long)(side_count + 1));
    ON_SimpleArray<ON_3dPoint>::SetCount((ON_SimpleArray<ON_3dPoint> *)this,side_count + 1);
    memcpy(local_b8,circle,0x88);
    dVar1 = circle->radius;
    dVar5 = cos(3.141592653589793 / (double)side_count);
    c.plane.plane_equation.d = dVar1 / dVar5;
    for (c.radius._4_4_ = 0; c.radius._4_4_ < side_count; c.radius._4_4_ = c.radius._4_4_ + 1) {
      ON_Circle::PointAt(&local_d0,(ON_Circle *)local_b8,
                         (3.141592653589793 / (double)side_count) * (double)(c.radius._4_4_ * 2 + 1)
                        );
      pOVar3 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a + c.radius._4_4_;
      pOVar3->x = local_d0.x;
      pOVar3->y = local_d0.y;
      pOVar3->z = local_d0.z;
    }
    pOVar3 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
    pOVar4 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a + side_count;
    pOVar4->x = pOVar3->x;
    pOVar4->y = pOVar3->y;
    pOVar4->z = pOVar3->z;
    ON_Circle::~ON_Circle((ON_Circle *)local_b8);
  }
  else {
    ON_SimpleArray<ON_3dPoint>::Destroy((ON_SimpleArray<ON_3dPoint> *)this);
  }
  return local_dd;
}

Assistant:

bool ON_Polyline::CreateCircumscribedPolygon(
            const ON_Circle& circle,
            int side_count
            )
{
  bool rc = ( circle.IsValid() && side_count >= 3 ) ? true : false;
  if ( rc )
  {
    SetCapacity(side_count+1);
    SetCount(side_count+1);
    double half_a = ON_PI/side_count;
    int i;
    ON_Circle c = circle;
    c.radius = circle.radius/cos(half_a);
    for ( i = 0; i < side_count; i++ )
    {
      m_a[i] = c.PointAt(half_a*(1+2*i));
    }
    m_a[side_count] = m_a[0];
  }
  else
    Destroy();
  return rc;
}